

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

DriveStrengthSyntax * __thiscall slang::parsing::Parser::parseDriveStrength(Parser *this)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  Token comma_00;
  Token strength1_00;
  Token closeParen_00;
  bool bVar1;
  uint uVar2;
  Diagnostic *pDVar3;
  undefined8 in_RDI;
  Token t;
  Token TVar4;
  Token t_00;
  Token openParen_00;
  Token closeParen;
  Token strength1;
  Token comma;
  Token strength0;
  Token openParen;
  anon_class_8_1_8991fb9c expectStrength;
  Diagnostic *in_stack_fffffffffffffe90;
  undefined6 in_stack_fffffffffffffe98;
  TokenKind in_stack_fffffffffffffe9e;
  SourceLocation in_stack_fffffffffffffea0;
  ParserBase *in_stack_fffffffffffffea8;
  ParserBase *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb8;
  TokenKind in_stack_fffffffffffffebe;
  undefined4 in_stack_fffffffffffffec0;
  DiagCode in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined8 in_stack_ffffffffffffff18;
  TokenKind kind;
  ParserBase *in_stack_ffffffffffffff20;
  Info *local_68;
  Info *local_60;
  Info *local_58;
  Info *local_40;
  TokenKind local_38;
  DriveStrengthSyntax *local_8;
  
  kind = (TokenKind)((ulong)in_stack_ffffffffffffff18 >> 0x30);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9e);
  if (bVar1) {
    ParserBase::consume(in_stack_fffffffffffffeb0);
    t = parseDriveStrength::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffebe);
    TVar4 = ParserBase::expect(in_stack_ffffffffffffff20,kind);
    t_00 = parseDriveStrength::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)
                      CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebe);
    openParen_00 = ParserBase::expect(in_stack_ffffffffffffff20,kind);
    local_38 = t.kind;
    bVar1 = slang::syntax::SyntaxFacts::isStrength0(local_38);
    uVar2 = (uint)bVar1;
    local_58._0_2_ = t_00.kind;
    bVar1 = slang::syntax::SyntaxFacts::isStrength0((TokenKind)local_58);
    local_58 = t_00._0_8_;
    if (uVar2 == bVar1) {
      Token::range((Token *)in_stack_fffffffffffffeb0);
      range_01.endLoc._0_6_ = in_stack_fffffffffffffeb8;
      range_01.startLoc = (SourceLocation)in_stack_fffffffffffffeb0;
      range_01.endLoc._6_2_ = in_stack_fffffffffffffebe;
      pDVar3 = ParserBase::addDiag(in_stack_fffffffffffffea8,in_stack_fffffffffffffec4,range_01);
      in_stack_fffffffffffffec0 = SUB84(pDVar3,0);
      in_stack_fffffffffffffec4 = SUB84((ulong)pDVar3 >> 0x20,0);
      Token::range((Token *)in_stack_fffffffffffffeb0);
      range.startLoc._6_2_ = in_stack_fffffffffffffe9e;
      range.startLoc._0_6_ = in_stack_fffffffffffffe98;
      range.endLoc = in_stack_fffffffffffffea0;
      Diagnostic::operator<<(in_stack_fffffffffffffe90,range);
    }
    else {
      bVar1 = isHighZ(t);
      if ((bVar1) && (bVar1 = isHighZ(t_00), bVar1)) {
        Token::range((Token *)in_stack_fffffffffffffeb0);
        range_02.endLoc._0_6_ = in_stack_fffffffffffffeb8;
        range_02.startLoc = (SourceLocation)in_stack_fffffffffffffeb0;
        range_02.endLoc._6_2_ = in_stack_fffffffffffffebe;
        ParserBase::addDiag(in_stack_fffffffffffffea8,in_stack_fffffffffffffec4,range_02);
        Token::range((Token *)in_stack_fffffffffffffeb0);
        range_00.startLoc._6_2_ = in_stack_fffffffffffffe9e;
        range_00.startLoc._0_6_ = in_stack_fffffffffffffe98;
        range_00.endLoc = in_stack_fffffffffffffea0;
        Diagnostic::operator<<(in_stack_fffffffffffffe90,range_00);
      }
    }
    local_40 = TVar4.info;
    local_68 = openParen_00._0_8_;
    local_60 = openParen_00.info;
    comma_00.rawLen._0_2_ = in_stack_fffffffffffffec4.subsystem;
    comma_00.rawLen._2_2_ = in_stack_fffffffffffffec4.code;
    comma_00.kind = (short)in_stack_fffffffffffffec0;
    comma_00._2_1_ = (char)((uint)in_stack_fffffffffffffec0 >> 0x10);
    comma_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffec0 >> 0x18);
    comma_00.info._0_4_ = in_stack_fffffffffffffec8;
    comma_00.info._4_4_ = uVar2;
    strength1_00.info = local_68;
    strength1_00.kind = (short)in_RDI;
    strength1_00._2_1_ = (char)((ulong)in_RDI >> 0x10);
    strength1_00.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
    strength1_00.rawLen = (int)((ulong)in_RDI >> 0x20);
    closeParen_00.info = local_58;
    closeParen_00._0_8_ = local_60;
    local_8 = slang::syntax::SyntaxFactory::driveStrength
                        ((SyntaxFactory *)local_40,openParen_00,t_00,comma_00,strength1_00,
                         closeParen_00);
  }
  else {
    local_8 = (DriveStrengthSyntax *)0x0;
  }
  return local_8;
}

Assistant:

DriveStrengthSyntax* Parser::parseDriveStrength() {
    if (!peek(TokenKind::OpenParenthesis))
        return nullptr;

    auto expectStrength = [&](TokenKind defaultKind) {
        Token next = peek();
        if (isDriveStrength(next.kind))
            return consume();

        addDiag(diag::ExpectedNetStrength, next.location());
        return missingToken(defaultKind, next.location());
    };

    auto openParen = consume();
    auto strength0 = expectStrength(TokenKind::Strong1Keyword);
    auto comma = expect(TokenKind::Comma);
    auto strength1 = expectStrength(TokenKind::Strong0Keyword);
    auto closeParen = expect(TokenKind::CloseParenthesis);

    if (isStrength0(strength0.kind) == isStrength0(strength1.kind))
        addDiag(diag::DriveStrengthInvalid, strength1.range()) << strength0.range();
    else if (isHighZ(strength0) && isHighZ(strength1))
        addDiag(diag::DriveStrengthHighZ, strength1.range()) << strength0.range();

    return &factory.driveStrength(openParen, strength0, comma, strength1, closeParen);
}